

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O2

void __thiscall
wasm::CoalesceLocals::pickIndices
          (CoalesceLocals *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  pointer *ppuVar1;
  Index IVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  size_t sVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var9
  ;
  uint uVar10;
  Index i;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjustedTotalCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  Index removedCopies;
  Index reverseRemovedCopies;
  pointer puStack_40;
  pointer local_38;
  
  IVar2 = (this->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          numLocals;
  if (IVar2 != 0) {
    if (IVar2 == 1) {
      local_80._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (indices,(uint *)local_80);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                 &(this->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .totalCopies);
      sVar8 = Function::getNumParams
                        ((this->
                         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                         .
                         super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .currFunction);
      for (uVar10 = 0; uVar10 < sVar8; uVar10 = uVar10 + 1) {
        *(undefined4 *)(CONCAT44(local_80._4_4_,local_80._0_4_) + (ulong)uVar10 * 4) = 0xffffffff;
      }
      makeIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &adjustedTotalCopies.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (this->
                   super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                   ).
                   super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                   .numLocals);
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &adjustedTotalCopies.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      ppuVar1 = &adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,
                 (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies);
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,indices,
                 (Index *)&order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      _Var9 = std::
              __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish);
      uVar10 = *_Var9._M_current;
      setIdentity((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
      iVar7 = -1;
      for (; uVar3 = (this->
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .numLocals, sVar8 < uVar3; sVar8 = sVar8 + 1) {
        adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[sVar8] = uVar3 + iVar7;
        iVar7 = iVar7 + -1;
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &adjustedTotalCopies.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
      ppuVar1 = &adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,
                 (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies);
      _removedCopies = (pointer)0x0;
      puStack_40 = (pointer)0x0;
      local_38 = (pointer)0x0;
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (Index *)((long)&order.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      _Var9 = std::
              __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_removedCopies,puStack_40);
      if (((uint)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage <
           order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_) ||
         ((order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ ==
           (uint)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage && (*_Var9._M_current < uVar10)))) {
        puVar4 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_38;
        puVar5 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = _removedCopies;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puStack_40;
        _removedCopies = puVar5;
        puStack_40 = puVar6;
        local_38 = puVar4;
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &adjustedTotalCopies.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    }
  }
  return;
}

Assistant:

void CoalesceLocals::pickIndices(std::vector<Index>& indices) {
  if (numLocals == 0) {
    return;
  }
  if (numLocals == 1) {
    indices.push_back(0);
    return;
  }
  // take into account total copies. but we must keep params in place, so give
  // them max priority
  auto adjustedTotalCopies = totalCopies;
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    adjustedTotalCopies[i] = std::numeric_limits<Index>::max();
  }
  // first try the natural order. this is less arbitrary than it seems, as the
  // program may have a natural order of locals inherent in it.
  auto order = makeIdentity(numLocals);
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  Index removedCopies;
  pickIndicesFromOrder(order, indices, removedCopies);
  auto maxIndex = *std::max_element(indices.begin(), indices.end());
  // next try the reverse order. this both gives us another chance at something
  // good, and also the very naturalness of the simple order may be quite
  // suboptimal
  setIdentity(order);
  for (Index i = numParams; i < numLocals; i++) {
    order[i] = numParams + numLocals - 1 - i;
  }
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  std::vector<Index> reverseIndices;
  Index reverseRemovedCopies;
  pickIndicesFromOrder(order, reverseIndices, reverseRemovedCopies);
  auto reverseMaxIndex =
    *std::max_element(reverseIndices.begin(), reverseIndices.end());
  // prefer to remove copies foremost, as it matters more for code size (minus
  // gzip), and improves throughput.
  if (reverseRemovedCopies > removedCopies ||
      (reverseRemovedCopies == removedCopies && reverseMaxIndex < maxIndex)) {
    indices.swap(reverseIndices);
  }
}